

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O1

void __thiscall RegressionTree::~RegressionTree(RegressionTree *this)

{
  ~RegressionTree(this);
  operator_delete(this);
  return;
}

Assistant:

RegressionTree::~RegressionTree()
{
    delete[] _queryRootIndex;
    delete[] _numOfCandidates;
    delete[] _complementFunction;
}